

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboCompletenessTests.cpp
# Opt level: O3

Checker * __thiscall
deqp::gles3::Functional::ES3CheckerFactory::createChecker
          (ES3CheckerFactory *this,RenderContext *ctx)

{
  Checker *this_00;
  
  this_00 = (Checker *)operator_new(0x58);
  deqp::gls::FboUtil::Checker::Checker(this_00,ctx);
  this_00->_vptr_Checker = (_func_int **)&PTR__Checker_00d102b0;
  this_00[1]._vptr_Checker = (_func_int **)0xffffffff;
  *(undefined4 *)&this_00[1].m_renderCtx = 0;
  return this_00;
}

Assistant:

Checker*			createChecker	(const glu::RenderContext& ctx) { return new ES3Checker(ctx); }